

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O2

ostream * operator<<(ostream *o,LinkedToken *t)

{
  ostream *poVar1;
  ostream *poVar2;
  
  poVar1 = std::operator<<((ostream *)o,"[token: ");
  poVar2 = operator<<((ostream *)poVar1,&t->token);
  poVar1 = std::operator<<((ostream *)poVar2,", url: ");
  poVar1 = std::operator<<(poVar1,(string *)&t->link);
  poVar1 = std::operator<<(poVar1,"]");
  return (ostream *)poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const LinkedToken& t) {
        return o << "[token: " << t.token << ", url: " << t.link << "]";
    }